

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSparse.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
BeliefSparse::InnerProduct
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,BeliefSparse *this,
          VectorSet *v,vector<bool,_std::allocator<bool>_> *mask)

{
  undefined1 auVar1 [16];
  BS *this_00;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  BScit it;
  double local_58;
  value_type_conflict3 local_50;
  long *local_48;
  allocator_type local_40 [8];
  long *local_38;
  
  local_50 = -1.79769313486232e+308;
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,v->size1_,&local_50,local_40);
  if (v->size1_ != 0) {
    this_00 = &this->_m_b;
    uVar2 = 0;
    do {
      if (((mask->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] >> (uVar2 & 0x3f) & 1) != 0) {
        boost::numeric::ublas::
        compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::find(this_00,0);
        local_58 = 0.0;
        while( true ) {
          boost::numeric::ublas::
          compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          ::find(this_00,this_00->size_);
          if (local_48 == local_38) break;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)((long)local_48 +
                                   (*(long *)((long)local_50 + 0x40) -
                                   *(long *)((long)local_50 + 0x28)));
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_58;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = (v->data_).data_[v->size2_ * uVar2 + *local_48];
          auVar1 = vfmadd231sd_fma(auVar4,auVar3,auVar1);
          local_58 = auVar1._0_8_;
          local_48 = local_48 + 1;
        }
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar2] = local_58;
      }
      uVar2 = (ulong)((int)uVar2 + 1);
    } while (v->size1_ != uVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> BeliefSparse::InnerProduct(const VectorSet &v,
                                          const vector<bool> &mask) const
{
    vector<double> values(v.size1(),-DBL_MAX);

    double x;
    for(unsigned int k=0;k!=v.size1();++k)
    {
        if(mask[k])
        {
            x=0;
            for(BScit it=_m_b.begin(); it!=_m_b.end(); ++it)
                x+=(*it)*v(k,it.index());
            values[k]=x;
        }
    }

    return(values);
}